

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O1

deBool qpTestLog_writeEglConfig(qpTestLog *log,qpEglConfigInfo *config)

{
  deBool dVar1;
  deBool dVar2;
  qpXmlAttribute attribs [64];
  qpXmlAttribute local_828;
  char *local_808;
  undefined4 local_800;
  char *local_7f8;
  int local_7f0;
  undefined4 local_7ec;
  char *local_7e8;
  undefined4 local_7e0;
  char *local_7d8;
  int local_7d0;
  undefined4 local_7cc;
  char *local_7c8;
  undefined4 local_7c0;
  char *local_7b8;
  int local_7b0;
  undefined4 local_7ac;
  char *local_7a8;
  undefined4 local_7a0;
  char *local_798;
  int local_790;
  undefined4 local_78c;
  char *local_788;
  undefined4 local_780;
  char *local_778;
  int local_770;
  undefined4 local_76c;
  char *local_768;
  undefined4 local_760;
  char *local_758;
  int local_750;
  undefined4 local_74c;
  char *local_748;
  undefined4 local_740;
  char *local_738;
  undefined4 local_730;
  deBool local_72c;
  char *local_728;
  undefined4 local_720;
  char *local_718;
  undefined4 local_710;
  deBool local_70c;
  char *local_708;
  undefined4 local_700;
  char *local_6f8;
  undefined8 local_6f0;
  char *local_6e8;
  undefined4 local_6e0;
  char *local_6d8;
  undefined8 local_6d0;
  char *local_6c8;
  undefined4 local_6c0;
  char *local_6b8;
  int local_6b0;
  undefined4 local_6ac;
  char *local_6a8;
  undefined4 local_6a0;
  char *local_698;
  undefined8 local_690;
  char *local_688;
  undefined4 local_680;
  char *local_678;
  int local_670;
  undefined4 local_66c;
  char *local_668;
  undefined4 local_660;
  char *local_658;
  int local_650;
  undefined4 local_64c;
  char *local_648;
  undefined4 local_640;
  char *local_638;
  int local_630;
  undefined4 local_62c;
  char *local_628;
  undefined4 local_620;
  char *local_618;
  int local_610;
  undefined4 local_60c;
  char *local_608;
  undefined4 local_600;
  char *local_5f8;
  int local_5f0;
  undefined4 local_5ec;
  char *local_5e8;
  undefined4 local_5e0;
  char *local_5d8;
  int local_5d0;
  undefined4 local_5cc;
  char *local_5c8;
  undefined4 local_5c0;
  char *local_5b8;
  int local_5b0;
  undefined4 local_5ac;
  char *local_5a8;
  undefined4 local_5a0;
  char *local_598;
  undefined4 local_590;
  deBool local_58c;
  char *local_588;
  undefined4 local_580;
  char *local_578;
  undefined8 local_570;
  char *local_568;
  undefined4 local_560;
  char *local_558;
  int local_550;
  undefined4 local_54c;
  char *local_548;
  undefined4 local_540;
  char *local_538;
  int local_530;
  undefined4 local_52c;
  char *local_528;
  undefined4 local_520;
  char *local_518;
  int local_510;
  undefined4 local_50c;
  char *local_508;
  undefined4 local_500;
  char *local_4f8;
  undefined8 local_4f0;
  char *local_4e8;
  undefined4 local_4e0;
  char *local_4d8;
  undefined8 local_4d0;
  char *local_4c8;
  undefined4 local_4c0;
  char *local_4b8;
  int local_4b0;
  undefined4 local_4ac;
  char *local_4a8;
  undefined4 local_4a0;
  char *local_498;
  int local_490;
  undefined4 local_48c;
  char *local_488;
  undefined4 local_480;
  char *local_478;
  int local_470;
  undefined4 local_46c;
  
  deMutex_lock(log->lock);
  local_828.intValue = config->bufferSize;
  local_828.name = "BufferSize";
  dVar2 = 1;
  local_828.type = QP_XML_ATTRIBUTE_INT;
  local_828.stringValue = "<intAttrib>";
  local_828.boolValue = -1;
  local_7f0 = config->redSize;
  local_808 = "RedSize";
  local_800 = 1;
  local_7f8 = "<intAttrib>";
  local_7ec = 0xffffffff;
  local_7d0 = config->greenSize;
  local_7e8 = "GreenSize";
  local_7e0 = 1;
  local_7d8 = "<intAttrib>";
  local_7cc = 0xffffffff;
  local_7b0 = config->blueSize;
  local_7c8 = "BlueSize";
  local_7c0 = 1;
  local_7b8 = "<intAttrib>";
  local_7ac = 0xffffffff;
  local_790 = config->luminanceSize;
  local_7a8 = "LuminanceSize";
  local_7a0 = 1;
  local_798 = "<intAttrib>";
  local_78c = 0xffffffff;
  local_770 = config->alphaSize;
  local_788 = "AlphaSize";
  local_780 = 1;
  local_778 = "<intAttrib>";
  local_76c = 0xffffffff;
  local_750 = config->alphaMaskSize;
  local_768 = "AlphaMaskSize";
  local_760 = 1;
  local_758 = "<intAttrib>";
  local_74c = 0xffffffff;
  local_72c = config->bindToTextureRGB;
  local_748 = "BindToTextureRGB";
  local_740 = 2;
  local_738 = "<boolAttrib>";
  local_730 = 0xfffffd59;
  local_70c = config->bindToTextureRGBA;
  local_728 = "BindToTextureRGBA";
  local_720 = 2;
  local_718 = "<boolAttrib>";
  local_710 = 0xfffffd59;
  local_6f8 = config->colorBufferType;
  local_708 = "ColorBufferType";
  local_700 = 0;
  local_6f0 = 0xfffffffffffffd5a;
  local_6d8 = config->configCaveat;
  local_6e8 = "ConfigCaveat";
  local_6e0 = 0;
  local_6d0 = 0xfffffffffffffd5a;
  local_6b0 = config->configID;
  local_6c8 = "ConfigID";
  local_6c0 = 1;
  local_6b8 = "<intAttrib>";
  local_6ac = 0xffffffff;
  local_698 = config->conformant;
  local_6a8 = "Conformant";
  local_6a0 = 0;
  local_690 = 0xfffffffffffffd5a;
  local_670 = config->depthSize;
  local_688 = "DepthSize";
  local_680 = 1;
  local_678 = "<intAttrib>";
  local_66c = 0xffffffff;
  local_650 = config->level;
  local_668 = "Level";
  local_660 = 1;
  local_658 = "<intAttrib>";
  local_64c = 0xffffffff;
  local_630 = config->maxPBufferWidth;
  local_648 = "MaxPBufferWidth";
  local_640 = 1;
  local_638 = "<intAttrib>";
  local_62c = 0xffffffff;
  local_610 = config->maxPBufferHeight;
  local_628 = "MaxPBufferHeight";
  local_620 = 1;
  local_618 = "<intAttrib>";
  local_60c = 0xffffffff;
  local_5f0 = config->maxPBufferPixels;
  local_608 = "MaxPBufferPixels";
  local_600 = 1;
  local_5f8 = "<intAttrib>";
  local_5ec = 0xffffffff;
  local_5d0 = config->maxSwapInterval;
  local_5e8 = "MaxSwapInterval";
  local_5e0 = 1;
  local_5d8 = "<intAttrib>";
  local_5cc = 0xffffffff;
  local_5b0 = config->minSwapInterval;
  local_5c8 = "MinSwapInterval";
  local_5c0 = 1;
  local_5b8 = "<intAttrib>";
  local_5ac = 0xffffffff;
  local_58c = config->nativeRenderable;
  local_5a8 = "NativeRenderable";
  local_5a0 = 2;
  local_598 = "<boolAttrib>";
  local_590 = 0xfffffd59;
  local_578 = config->renderableType;
  local_588 = "RenderableType";
  local_580 = 0;
  local_570 = 0xfffffffffffffd5a;
  local_550 = config->sampleBuffers;
  local_568 = "SampleBuffers";
  local_560 = 1;
  local_558 = "<intAttrib>";
  local_54c = 0xffffffff;
  local_530 = config->samples;
  local_548 = "Samples";
  local_540 = 1;
  local_538 = "<intAttrib>";
  local_52c = 0xffffffff;
  local_510 = config->stencilSize;
  local_528 = "StencilSize";
  local_520 = 1;
  local_518 = "<intAttrib>";
  local_50c = 0xffffffff;
  local_4f8 = config->surfaceTypes;
  local_508 = "SurfaceTypes";
  local_500 = 0;
  local_4f0 = 0xfffffffffffffd5a;
  local_4d8 = config->transparentType;
  local_4e8 = "TransparentType";
  local_4e0 = 0;
  local_4d0 = 0xfffffffffffffd5a;
  local_4b0 = config->transparentRedValue;
  local_4c8 = "TransparentRedValue";
  local_4c0 = 1;
  local_4b8 = "<intAttrib>";
  local_4ac = 0xffffffff;
  local_490 = config->transparentGreenValue;
  local_4a8 = "TransparentGreenValue";
  local_4a0 = 1;
  local_498 = "<intAttrib>";
  local_48c = 0xffffffff;
  local_470 = config->transparentBlueValue;
  local_488 = "TransparentBlueValue";
  local_480 = 1;
  local_478 = "<intAttrib>";
  local_46c = 0xffffffff;
  dVar1 = qpXmlWriter_startElement(log->writer,"EglConfig",0x1e,&local_828);
  if (dVar1 != 0) {
    dVar1 = qpXmlWriter_endElement(log->writer,"EglConfig");
    if (dVar1 != 0) goto LAB_01a3411f;
  }
  qpPrintf("qpTestLog_writeEglConfig(): Writing XML failed\n");
  dVar2 = 0;
LAB_01a3411f:
  deMutex_unlock(log->lock);
  return dVar2;
}

Assistant:

deBool qpTestLog_writeEglConfig (qpTestLog* log, const qpEglConfigInfo* config)
{
	qpXmlAttribute	attribs[64];
	int				numAttribs = 0;

	DE_ASSERT(log && config);
	deMutex_lock(log->lock);

	attribs[numAttribs++] = qpSetIntAttrib		("BufferSize", config->bufferSize);
	attribs[numAttribs++] = qpSetIntAttrib		("RedSize", config->redSize);
	attribs[numAttribs++] = qpSetIntAttrib		("GreenSize", config->greenSize);
	attribs[numAttribs++] = qpSetIntAttrib		("BlueSize", config->blueSize);
	attribs[numAttribs++] = qpSetIntAttrib		("LuminanceSize", config->luminanceSize);
	attribs[numAttribs++] = qpSetIntAttrib		("AlphaSize", config->alphaSize);
	attribs[numAttribs++] = qpSetIntAttrib		("AlphaMaskSize", config->alphaMaskSize);
	attribs[numAttribs++] = qpSetBoolAttrib		("BindToTextureRGB", config->bindToTextureRGB);
	attribs[numAttribs++] = qpSetBoolAttrib		("BindToTextureRGBA", config->bindToTextureRGBA);
	attribs[numAttribs++] = qpSetStringAttrib	("ColorBufferType", config->colorBufferType);
	attribs[numAttribs++] = qpSetStringAttrib	("ConfigCaveat", config->configCaveat);
	attribs[numAttribs++] = qpSetIntAttrib		("ConfigID", config->configID);
	attribs[numAttribs++] = qpSetStringAttrib	("Conformant", config->conformant);
	attribs[numAttribs++] = qpSetIntAttrib		("DepthSize", config->depthSize);
	attribs[numAttribs++] = qpSetIntAttrib		("Level", config->level);
	attribs[numAttribs++] = qpSetIntAttrib		("MaxPBufferWidth", config->maxPBufferWidth);
	attribs[numAttribs++] = qpSetIntAttrib		("MaxPBufferHeight", config->maxPBufferHeight);
	attribs[numAttribs++] = qpSetIntAttrib		("MaxPBufferPixels", config->maxPBufferPixels);
	attribs[numAttribs++] = qpSetIntAttrib		("MaxSwapInterval", config->maxSwapInterval);
	attribs[numAttribs++] = qpSetIntAttrib		("MinSwapInterval", config->minSwapInterval);
	attribs[numAttribs++] = qpSetBoolAttrib		("NativeRenderable", config->nativeRenderable);
	attribs[numAttribs++] = qpSetStringAttrib	("RenderableType", config->renderableType);
	attribs[numAttribs++] = qpSetIntAttrib		("SampleBuffers", config->sampleBuffers);
	attribs[numAttribs++] = qpSetIntAttrib		("Samples", config->samples);
	attribs[numAttribs++] = qpSetIntAttrib		("StencilSize", config->stencilSize);
	attribs[numAttribs++] = qpSetStringAttrib	("SurfaceTypes", config->surfaceTypes);
	attribs[numAttribs++] = qpSetStringAttrib	("TransparentType", config->transparentType);
	attribs[numAttribs++] = qpSetIntAttrib		("TransparentRedValue", config->transparentRedValue);
	attribs[numAttribs++] = qpSetIntAttrib		("TransparentGreenValue", config->transparentGreenValue);
	attribs[numAttribs++] = qpSetIntAttrib		("TransparentBlueValue", config->transparentBlueValue);
	DE_ASSERT(numAttribs <= DE_LENGTH_OF_ARRAY(attribs));

	if (!qpXmlWriter_startElement(log->writer, "EglConfig", numAttribs, attribs) ||
		!qpXmlWriter_endElement(log->writer, "EglConfig"))
	{
		qpPrintf("qpTestLog_writeEglConfig(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		return DE_FALSE;
	}

	deMutex_unlock(log->lock);
	return DE_TRUE;
}